

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSpline.cpp
# Opt level: O0

void __thiscall
IGACpp::BSpline::setKnotVectors(BSpline *this,vector<double,_std::allocator<double>_> *knotVector)

{
  double dVar1;
  size_type sVar2;
  reference pvVar3;
  runtime_error *this_00;
  ulong local_20;
  size_t i;
  vector<double,_std::allocator<double>_> *knotVector_local;
  BSpline *this_local;
  
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(knotVector);
    if (sVar2 - 1 <= local_20) {
      std::vector<double,_std::allocator<double>_>::operator=(&this->_knotVector,knotVector);
      return;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::at(knotVector,local_20);
    dVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::at(knotVector,local_20 + 1);
    if (*pvVar3 <= dVar1 && dVar1 != *pvVar3) break;
    local_20 = local_20 + 1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"BSpline::setKnotVectors: knot vector must be in increasing order.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BSpline::setKnotVectors(std::vector<double> knotVector)
    {
        // check if the given knot vector is non-decreasing
        for (size_t i{}; i < (knotVector.size() - 1); ++i)
        {
            if (knotVector.at(i) > knotVector.at(i + 1))
            {
                throw std::runtime_error("BSpline::setKnotVectors: knot vector must be in increasing order.");
            }
        }

        // set knotvector
        _knotVector = knotVector;
    }